

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBars<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,int count,double width,
               int offset,int stride)

{
  GetterXsYs<unsigned_long_long> getter;
  GetterXsYs<unsigned_long_long> local_20;
  
  if (count == 0) {
    local_20.Offset = 0;
  }
  else {
    local_20.Offset = (offset % count + count) % count;
  }
  local_20.Xs = xs;
  local_20.Ys = ys;
  local_20.Count = count;
  local_20.Stride = stride;
  PlotBarsEx<ImPlot::GetterXsYs<unsigned_long_long>>(label_id,&local_20,width);
  return;
}

Assistant:

void PlotBars(const char* label_id, const T* xs, const T* ys, int count, double width, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsEx(label_id, getter, width);
}